

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

string * __thiscall Assimp::FIDoubleValueImpl::toString_abi_cxx11_(FIDoubleValueImpl *this)

{
  anon_class_16_2_7fa2732d __f;
  int n;
  ostringstream os;
  int local_1ac;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  if (this->strValueValid == false) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream(local_188);
    local_1ac = 0;
    __f.os = (ostringstream *)local_188;
    __f.n = &local_1ac;
    std::
    for_each<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,Assimp::FIDoubleValueImpl::toString[abi:cxx11]()const::_lambda(double)_1_>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               (this->super_FIDoubleValue).value.super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               (this->super_FIDoubleValue).value.super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_finish,__f);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->strValue,(string *)local_1a8);
    if (local_1a8[0] != local_198) {
      operator_delete(local_1a8[0]);
    }
    std::__cxx11::ostringstream::~ostringstream(local_188);
    std::ios_base::~ios_base(local_118);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            int n = 0;
            std::for_each(value.begin(), value.end(), [&](double d) { if (++n > 1) os << ' '; os << d; });
            strValue = os.str();
        }
        return strValue;
    }